

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_UpdateLFO(ym3438_t *chip)

{
  ym3438_t *chip_local;
  
  if (((uint)chip->lfo_quotient & lfo_cycles[chip->lfo_freq]) == lfo_cycles[chip->lfo_freq]) {
    chip->lfo_quotient = '\0';
    chip->lfo_cnt = chip->lfo_cnt + '\x01';
  }
  else {
    chip->lfo_quotient = chip->lfo_quotient + chip->lfo_inc;
  }
  chip->lfo_cnt = chip->lfo_cnt & chip->lfo_en;
  return;
}

Assistant:

static void NOPN2_UpdateLFO(ym3438_t *chip)
{
    if ((chip->lfo_quotient & lfo_cycles[chip->lfo_freq]) == lfo_cycles[chip->lfo_freq])
    {
        chip->lfo_quotient = 0;
        chip->lfo_cnt++;
    }
    else
    {
        chip->lfo_quotient += chip->lfo_inc;
    }
    chip->lfo_cnt &= chip->lfo_en;
}